

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O1

mraa_result_t mraa_atoi(char *intStr,int *value)

{
  char *in_RAX;
  long lVar1;
  int *piVar2;
  mraa_result_t mVar3;
  long lVar4;
  int iVar5;
  char *end;
  char *local_38;
  
  local_38 = in_RAX;
  lVar1 = strtol(intStr,&local_38,10);
  mVar3 = MRAA_ERROR_UNSPECIFIED;
  iVar5 = 0;
  if (*local_38 == '\0') {
    piVar2 = __errno_location();
    if (*piVar2 != 0x22) {
      iVar5 = (int)lVar1;
      lVar4 = (long)iVar5;
      if (lVar4 != lVar1 || local_38 == intStr) {
        iVar5 = 0;
      }
      mVar3 = MRAA_ERROR_UNSPECIFIED;
      if (lVar4 == lVar1 && local_38 != intStr) {
        mVar3 = MRAA_SUCCESS;
      }
    }
  }
  *value = iVar5;
  return mVar3;
}

Assistant:

mraa_result_t
mraa_atoi(char* intStr, int* value)
{
    char* end;
    // here 10 determines the number base in which strol is to work
    long val = strtol(intStr, &end, 10);
    if (*end != '\0' || errno == ERANGE || end == intStr || val > INT_MAX || val < INT_MIN) {
        *value = 0;
        return MRAA_ERROR_UNSPECIFIED;
    }
    *value = (int) val;
    return MRAA_SUCCESS;
}